

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_char,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<48U,_unsigned_char,_void,_false> *this,limb_type_conflict1 short_denominator,
          unsigned_fast_type u_offset,uintwide_t<48U,_unsigned_char,_void,_false> *remainder)

{
  uint uVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  long lVar5;
  undefined8 uStack_18;
  
  uVar2 = 0;
  uVar4 = (uint)CONCAT71(in_register_00000031,short_denominator) & 0xffff;
  uVar1 = 0;
  for (lVar5 = (long)(6 - (int)u_offset); lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = (uVar2 - (uVar1 & 0xff) * uVar4) * 0x100;
    uVar3 = (uint)(this->values).super_array<unsigned_char,_6UL>.elems[lVar5 + -1];
    uVar2 = uVar1 | uVar3;
    uVar1 = (uVar1 & 0xffff | uVar3) /
            (uint)(ushort)CONCAT71(in_register_00000031,short_denominator);
    (this->values).super_array<unsigned_char,_6UL>.elems[lVar5 + -1] = (value_type_conflict4)uVar1;
  }
  if (remainder != (uintwide_t<48U,_unsigned_char,_void,_false> *)0x0) {
    uStack_18 = in_RAX;
    uintwide_t<48u,unsigned_char,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
    enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std
    ::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_char>::digits),void>::
    type__((void *)((long)&uStack_18 + 2),(char)uVar2 - (char)uVar1 * (char)uVar4,
           (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
            *)0x0);
    *(undefined2 *)((remainder->values).super_array<unsigned_char,_6UL>.elems + 4) = uStack_18._6_2_
    ;
    *(undefined4 *)(remainder->values).super_array<unsigned_char,_6UL>.elems = uStack_18._2_4_;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }